

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void tplt_linedir(FILE *out,int lineno,char *filename)

{
  fprintf((FILE *)out,"#line %d \"",lineno);
  do {
    if (*filename == '\\') {
      putc(0x5c,(FILE *)out);
    }
    else if (*filename == '\0') {
      fwrite("\"\n",2,1,(FILE *)out);
      return;
    }
    putc((int)*filename,(FILE *)out);
    filename = filename + 1;
  } while( true );
}

Assistant:

PRIVATE void tplt_linedir(FILE *out, int lineno, char *filename)
{
  fprintf(out,"#line %d \"",lineno);
  while( *filename ){
    if( *filename == '\\' ) putc('\\',out);
    putc(*filename,out);
    filename++;
  }
  fprintf(out,"\"\n");
}